

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

_Bool check_serialization(roaring_bitmap_t *bitmap)

{
  byte bVar1;
  roaring_bitmap_t *r2;
  void *__ptr;
  roaring_bitmap_t *in_RDI;
  _Bool ret;
  roaring_bitmap_t *deserializedBitmap;
  char *data;
  size_t size;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  roaring_bitmap_t *in_stack_ffffffffffffffe0;
  
  r2 = (roaring_bitmap_t *)roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)0x1035e3);
  __ptr = malloc((size_t)r2);
  roaring_bitmap_portable_serialize
            (in_stack_ffffffffffffffe0,
             (char *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  roaring_bitmap_portable_deserialize((char *)0x103610);
  bVar1 = roaring_bitmap_equals(in_RDI,r2);
  roaring_bitmap_free((roaring_bitmap_t *)0x103634);
  free(__ptr);
  return (_Bool)(bVar1 & 1);
}

Assistant:

bool check_serialization(roaring_bitmap_t *bitmap) {
    const size_t size = roaring_bitmap_portable_size_in_bytes(bitmap);
    char *data = (char *)malloc(size);
    roaring_bitmap_portable_serialize(bitmap, data);
    roaring_bitmap_t *deserializedBitmap =
        roaring_bitmap_portable_deserialize(data);
    bool ret = roaring_bitmap_equals(bitmap, deserializedBitmap);
    roaring_bitmap_free(deserializedBitmap);
    free(data);
    return ret;
}